

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

MoveFull * __thiscall
banksia::BoardCore::createFullMove
          (MoveFull *__return_storage_ptr__,BoardCore *this,int from,int dest,PieceType promotion)

{
  pointer pPVar1;
  int iVar2;
  
  (__return_storage_ptr__->super_Move).from = from;
  (__return_storage_ptr__->super_Move).dest = dest;
  (__return_storage_ptr__->super_Move).promotion = promotion;
  iVar2 = (*(this->super_Obj)._vptr_Obj[6])(this,(ulong)(uint)from);
  if ((char)iVar2 != '\0') {
    pPVar1 = (this->pieces).super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->pieces).
                      super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pPVar1 >> 3) <= (ulong)(long)from) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    __return_storage_ptr__->piece = pPVar1[from];
  }
  return __return_storage_ptr__;
}

Assistant:

MoveFull BoardCore::createFullMove(int from, int dest, PieceType promotion) const
{
    MoveFull move(from, dest, promotion);
    if (isPositionValid(from)) {
        move.piece = getPiece(from);
    }
    return move;
}